

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparsityStructure.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::SparsityStructure::addNonZero
          (SparsityStructure *this,size_t row,size_t col)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffff30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff40;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined1 local_78 [64];
  string local_38 [56];
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_ffffffffffffff40,(value_type_conflict1 *)in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_ffffffffffffff40,(value_type_conflict1 *)in_RDI);
  this_00 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78;
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff68);
  std::operator+(in_RDI,in_stack_ffffffffffffff30);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff68);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this_00,in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)(local_78 + 0x20));
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void iDynTree::optimalcontrol::SparsityStructure::addNonZero(size_t row, size_t col)
{
    m_nonZeroElementRows.push_back(row);
    m_nonZeroElementColumns.push_back(col);
    m_register.insert(std::to_string(row) + "_" + std::to_string(col));
}